

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O3

Var Js::TaggedInt::NegateUnchecked(Var aValue)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  char *fileName;
  ulong uVar7;
  bool bVar8;
  
  uVar7 = (ulong)aValue & 0xffff000000000000;
  bVar8 = ((ulong)aValue & 0x1ffff00000000) == 0x1000000000000;
  if (bVar8 || uVar7 != 0x1000000000000) {
    if (uVar7 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/TaggedInt.cpp"
      ;
      pcVar5 = "(Is(aValue))";
      pcVar4 = "Ensure var is actually a \'TaggedInt\'";
      uVar6 = 0x204;
      goto LAB_00b0cc68;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    pcVar5 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar4 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar6 = 0x2a;
LAB_00b0cc68:
    bVar2 = Throw::ReportAssert(fileName,uVar6,pcVar5,pcVar4);
    if (!bVar2) goto LAB_00b0ce8c;
    *puVar3 = 0;
  }
  if ((undefined1 *)aValue == &DAT_1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/TaggedInt.cpp"
                                ,0x205,"(aValue != ToVarUnchecked(0))",
                                "Do not use NegateUnchecked on zero because NegativeZero is special"
                               );
    if (!bVar2) goto LAB_00b0ce8c;
    *puVar3 = 0;
  }
  else if (aValue == (Var)0x1000080000000) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/TaggedInt.cpp"
                                ,0x206,"(aValue != ToVarUnchecked(k_nMinValue))",
                                "Do not use NegateUnchecked on min value because it cannot be represented"
                               );
    if (!bVar2) goto LAB_00b0ce8c;
    *puVar3 = 0;
  }
  if (bVar8 || uVar7 != 0x1000000000000) {
    if (uVar7 == 0x1000000000000) goto LAB_00b0ce75;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
    if (!bVar8) goto LAB_00b0ce8c;
    *puVar3 = 0;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar3 = 1;
    pcVar5 = "(Is(aValue))";
    pcVar4 = "Ensure var is actually a \'TaggedInt\'";
    uVar6 = 0x43;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar8) goto LAB_00b0ce8c;
    *puVar3 = 0;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar3 = 1;
    pcVar5 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar4 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar6 = 0x2a;
  }
  bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                              ,uVar6,pcVar5,pcVar4);
  if (!bVar8) {
LAB_00b0ce8c:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_00b0ce75:
  return (Var)((ulong)(uint)-(int)aValue | 0x1000000000000);
}

Assistant:

Var TaggedInt::NegateUnchecked(Var aValue)
    {
        AssertMsg( Is(aValue), "Ensure var is actually a 'TaggedInt'");
        AssertMsg( aValue != ToVarUnchecked(0), "Do not use NegateUnchecked on zero because NegativeZero is special");
        AssertMsg( aValue != ToVarUnchecked(k_nMinValue), "Do not use NegateUnchecked on min value because it cannot be represented");

#if INT32VAR
        int n = ToInt32(aValue);
        Var result = ToVarUnchecked( 0 - n );
#else
        int n = reinterpret_cast<int>(aValue);

        // Negation can be done by subtracting from "zero". The following method
        // is just two operations: "load constant; sub"
        // The constant 2 in the following expression
        // a) adjusts for the bias of ToVarUnchecked(0) and
        // b) ensures the tag bit is set
        Var result = reinterpret_cast<Var>( 2 - n );
#endif

        // Check against the long way (shift, negate, shift, or)
        AssertMsg( result == ToVarUnchecked( -ToInt32(aValue) ), "Logic error in NegateUnchecked" );
        return result;
    }